

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsectoreffect.cpp
# Opt level: O3

void __thiscall DMovingFloor::DMovingFloor(DMovingFloor *this,sector_t_conflict *sector)

{
  DInterpolation *pDVar1;
  
  DThinker::DThinker((DThinker *)this,0x65);
  (this->super_DMover).super_DSectorEffect.m_Sector = sector;
  (this->super_DMover).interpolation.field_0.p = (DInterpolation *)0x0;
  (this->super_DMover).super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_006f4b98;
  (sector->floordata).field_0.p = (DSectorEffect *)this;
  pDVar1 = sector_t::SetInterpolation((sector_t *)sector,1,true);
  (this->super_DMover).interpolation.field_0.p = pDVar1;
  return;
}

Assistant:

DMovingFloor::DMovingFloor (sector_t *sector)
	: DMover (sector)
{
	sector->floordata = this;
	interpolation = sector->SetInterpolation(sector_t::FloorMove, true);
}